

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathObjectPtr xmlXPathConvertBoolean(xmlXPathObjectPtr val)

{
  int iVar1;
  xmlXPathObjectPtr pxVar2;
  
  if (val == (xmlXPathObjectPtr)0x0) {
    pxVar2 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
    if (pxVar2 == (xmlXPathObjectPtr)0x0) {
      pxVar2 = (xmlXPathObjectPtr)0x0;
    }
    else {
      *(undefined8 *)pxVar2 = 0;
      pxVar2->nodesetval = (xmlNodeSetPtr)0x0;
      *(undefined8 *)&pxVar2->boolval = 0;
      pxVar2->floatval = 0.0;
      *(undefined8 *)&pxVar2->index = 0;
      pxVar2->user2 = (void *)0x0;
      pxVar2->stringval = (xmlChar *)0x0;
      pxVar2->user = (void *)0x0;
      *(undefined8 *)&pxVar2->index2 = 0;
      pxVar2->type = XPATH_BOOLEAN;
      pxVar2->boolval = 0;
    }
  }
  else {
    pxVar2 = val;
    if (val->type != XPATH_BOOLEAN) {
      iVar1 = xmlXPathCastToBoolean(val);
      pxVar2 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
      if (pxVar2 == (xmlXPathObjectPtr)0x0) {
        pxVar2 = (xmlXPathObjectPtr)0x0;
      }
      else {
        *(undefined8 *)pxVar2 = 0;
        pxVar2->nodesetval = (xmlNodeSetPtr)0x0;
        *(undefined8 *)&pxVar2->boolval = 0;
        pxVar2->floatval = 0.0;
        *(undefined8 *)&pxVar2->index = 0;
        pxVar2->user2 = (void *)0x0;
        pxVar2->stringval = (xmlChar *)0x0;
        pxVar2->user = (void *)0x0;
        *(undefined8 *)&pxVar2->index2 = 0;
        pxVar2->type = XPATH_BOOLEAN;
        pxVar2->boolval = (uint)(iVar1 != 0);
      }
      xmlXPathFreeObject(val);
    }
  }
  return pxVar2;
}

Assistant:

xmlXPathObjectPtr
xmlXPathConvertBoolean(xmlXPathObjectPtr val) {
    xmlXPathObjectPtr ret;

    if (val == NULL)
	return(xmlXPathNewBoolean(0));
    if (val->type == XPATH_BOOLEAN)
	return(val);
    ret = xmlXPathNewBoolean(xmlXPathCastToBoolean(val));
    xmlXPathFreeObject(val);
    return(ret);
}